

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

void duckdb_je_emap_deregister_interior(tsdn_t *tsdn,emap_t *emap,edata_t *edata)

{
  rtree_ctx_cache_elm_t *prVar1;
  rtree_ctx_cache_elm_t *prVar2;
  rtree_ctx_cache_elm_t *prVar3;
  ulong *puVar4;
  rtree_leaf_elm_t *prVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  rtree_leaf_elm_t *prVar8;
  ulong uVar9;
  ulong uVar10;
  rtree_ctx_cache_elm_t *prVar11;
  rtree_ctx_cache_elm_t *prVar12;
  ulong key;
  ulong uVar13;
  rtree_ctx_t *ctx;
  bool bVar14;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar7 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  if (0x2000 < uVar7) {
    uVar13 = (ulong)edata->e_addr & 0xfffffffffffff000;
    uVar7 = (uVar7 + uVar13) - 0x2000;
    uVar13 = uVar13 + 0x1000;
    if (uVar13 <= uVar7) {
      prVar2 = ctx->l2_cache;
      prVar3 = ctx->l2_cache + 1;
      prVar8 = (rtree_leaf_elm_t *)0x0;
      key = uVar13;
      do {
        if (key == uVar13 || (key & 0x3fffffff) == 0) {
          prVar8 = (rtree_leaf_elm_t *)(key & 0xffffffffc0000000);
          uVar9 = (ulong)(((uint)(key >> 0x1e) & 0xf) << 4);
          puVar4 = (ulong *)((long)&ctx->cache[0].leafkey + uVar9);
          prVar5 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + uVar9);
          if (prVar5 == prVar8) {
            prVar8 = (rtree_leaf_elm_t *)((ulong)((uint)(key >> 9) & 0x1ffff8) + puVar4[1]);
          }
          else if ((rtree_leaf_elm_t *)prVar2->leafkey == prVar8) {
            prVar6 = ctx->l2_cache[0].leaf;
            ctx->l2_cache[0].leafkey = (uintptr_t)prVar5;
            ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar4[1];
            *puVar4 = (ulong)prVar8;
            puVar4[1] = (ulong)prVar6;
            prVar8 = (rtree_leaf_elm_t *)
                     ((long)&(prVar6->le_bits).repr + (ulong)((uint)(key >> 9) & 0x1ffff8));
          }
          else {
            if ((rtree_leaf_elm_t *)prVar3->leafkey == prVar8) {
              uVar10 = 0;
              bVar14 = false;
              prVar12 = prVar3;
            }
            else {
              uVar9 = 1;
              prVar11 = prVar3;
              do {
                uVar10 = uVar9;
                bVar14 = 6 < uVar10;
                if (uVar10 == 7) goto LAB_01dac902;
                prVar12 = prVar11 + 1;
                prVar1 = prVar11 + 1;
                uVar9 = uVar10 + 1;
                prVar11 = prVar12;
              } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar8);
              bVar14 = 6 < uVar10;
            }
            prVar6 = prVar12->leaf;
            prVar12->leafkey = prVar2[uVar10].leafkey;
            prVar12->leaf = ctx->l2_cache[uVar10].leaf;
            prVar2[uVar10].leafkey = (uintptr_t)prVar5;
            ctx->l2_cache[uVar10].leaf = (rtree_leaf_elm_t *)puVar4[1];
            *puVar4 = (ulong)prVar8;
            puVar4[1] = (ulong)prVar6;
            prVar8 = (rtree_leaf_elm_t *)
                     ((long)&(prVar6->le_bits).repr + (ulong)((uint)(key >> 9) & 0x1ffff8));
LAB_01dac902:
            if (bVar14) {
              prVar8 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,key,true,false);
            }
          }
        }
        (prVar8->le_bits).repr = (void *)0xe8000000000000;
        prVar8 = prVar8 + 1;
        key = key + 0x1000;
      } while (key <= uVar7);
    }
  }
  return;
}

Assistant:

void
emap_deregister_interior(tsdn_t *tsdn, emap_t *emap, edata_t *edata) {
	EMAP_DECLARE_RTREE_CTX;

	assert(edata_slab_get(edata));
	if (edata_size_get(edata) > (2 << LG_PAGE)) {
		rtree_clear_range(tsdn, &emap->rtree, rtree_ctx,
		    (uintptr_t)edata_base_get(edata) + PAGE,
		    (uintptr_t)edata_last_get(edata) - PAGE);
	}
}